

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::Str::replaceAll(string *str,char replaceWhat,char replaceWith)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char local_12;
  char local_11;
  char replaceWith_local;
  string *psStack_10;
  char replaceWhat_local;
  string *str_local;
  
  local_12 = replaceWith;
  local_11 = replaceWhat;
  psStack_10 = str;
  __first._M_current = (char *)::std::__cxx11::string::begin();
  __last._M_current = (char *)::std::__cxx11::string::end();
  ::std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,__last,&local_11,&local_12);
  return psStack_10;
}

Assistant:

std::string& Str::replaceAll(std::string& str, char replaceWhat, char replaceWith) {
  std::replace(str.begin(), str.end(), replaceWhat, replaceWith);
  return str;
}